

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O3

void __thiscall rtosc::UndoHistory::recordEvent(UndoHistory *this,char *msg)

{
  long *plVar1;
  _Map_pointer pppVar2;
  _Map_pointer pppVar3;
  bool bVar4;
  size_t N;
  char *buf;
  time_t now;
  pair<long,_const_char_*> *ppVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  UndoHistoryImpl *pUVar9;
  pair<long,_const_char_*> local_38;
  
  pUVar9 = this->impl;
  pppVar2 = (pUVar9->history).
            super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(pUVar9->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(pUVar9->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
      ((long)(pUVar9->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(pUVar9->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
      ((((ulong)((long)pppVar2 -
                (long)(pUVar9->history).
                      super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(pppVar2 == (_Map_pointer)0x0)) * 0x20 != (pUVar9->history_pos & 0xffffffffU)) {
    std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
    resize(&pUVar9->history,pUVar9->history_pos);
  }
  N = rtosc_message_length(msg,0xffffffffffffffff);
  buf = (char *)operator_new__(N);
  now = time((time_t *)0x0);
  bVar4 = UndoHistoryImpl::mergeEvent(this->impl,now,msg,buf,N);
  if (bVar4) {
    return;
  }
  memcpy(buf,msg,N);
  local_38.first = now;
  local_38.second = buf;
  std::deque<std::pair<long,char_const*>,std::allocator<std::pair<long,char_const*>>>::
  emplace_back<std::pair<long,char_const*>>
            ((deque<std::pair<long,char_const*>,std::allocator<std::pair<long,char_const*>>> *)
             this->impl,&local_38);
  pUVar9 = this->impl;
  pUVar9->history_pos = pUVar9->history_pos + 1;
  pppVar2 = (pUVar9->history).
            super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar3 = (pUVar9->history).
            super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar5 = (pUVar9->history).
           super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (((long)(pUVar9->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar5 >> 4) +
      ((long)(pUVar9->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(pUVar9->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
      ((((ulong)((long)pppVar2 - (long)pppVar3) >> 3) - 1) + (ulong)(pppVar2 == (_Map_pointer)0x0))
      * 0x20 <= (ulong)pUVar9->max_history_size) {
    return;
  }
  lVar7 = (long)ppVar5 -
          (long)(pUVar9->history).
                super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first;
  uVar6 = lVar7 >> 4;
  if ((long)uVar6 < 0) {
    uVar8 = lVar7 >> 9;
  }
  else {
    if (uVar6 < 0x20) goto LAB_001110a2;
    uVar8 = uVar6 >> 5;
  }
  ppVar5 = pppVar3[uVar8] + uVar6 + uVar8 * -0x20;
LAB_001110a2:
  if (ppVar5->second != (char *)0x0) {
    operator_delete__(ppVar5->second);
    pUVar9 = this->impl;
  }
  std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
  pop_front(&pUVar9->history);
  plVar1 = &this->impl->history_pos;
  *plVar1 = *plVar1 + -1;
  return;
}

Assistant:

void UndoHistory::recordEvent(const char *msg)
{
    //TODO Properly account for when you have traveled back in time.
    //while this could result in another branch of history, the simple method
    //would be to kill off any future redos when new history is recorded
    if(impl->history.size() != (unsigned) impl->history_pos) {
        impl->history.resize(impl->history_pos);
    }

    size_t len = rtosc_message_length(msg, -1);
    char *data = new char[len];
    time_t now = time(NULL);
    //printf("now = '%ld'\n", now);
    if(!impl->mergeEvent(now, msg, data, len)) {
        memcpy(data, msg, len);
        impl->history.push_back(make_pair(now, data));
        impl->history_pos++;
        if(impl->history.size() > impl->max_history_size)
        {
            delete[] impl->history[0].second;
            impl->history.pop_front();
            impl->history_pos--;
        }
    }

}